

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive8.cpp
# Opt level: O3

size_t __thiscall embree::CurveNiMB<8>::Type::getBytes(Type *this,char *This)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  
  bVar1 = *This;
  uVar2 = (**(code **)((long)*this + 8))();
  if ((bVar1 & 0x1c) == 0) {
    sVar4 = (uVar2 * 4 + 0x1c & 0xffffffffffffffe0) * 3;
  }
  else {
    uVar3 = (ulong)((uint)uVar2 & 7);
    lVar5 = uVar3 * 0x25 + 0x1e;
    if (uVar3 == 0) {
      lVar5 = 0;
    }
    sVar4 = lVar5 + (uVar2 >> 3) * 0x146;
  }
  return sVar4;
}

Assistant:

size_t Curve8iMB::Type::getBytes(const char* This) const
  {
    if ((*This & Geometry::GType::GTY_BASIS_MASK) == Geometry::GType::GTY_BASIS_LINEAR)
       return Line8i::bytes(sizeActive(This));
     else
       return Curve8iMB::bytes(sizeActive(This));
  }